

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispPrint.h
# Opt level: O1

string * __thiscall FormToken::toString_abi_cxx11_(string *__return_storage_ptr__,FormToken *this)

{
  runtime_error *this_00;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch(this->kind) {
  case WHITESPACE:
    break;
  case SYMBOL:
  case SPECIAL_SYMBOL:
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(((this->field_1).str)->_M_dataplus)._M_p);
    return __return_storage_ptr__;
  case OPEN_PAREN:
    break;
  case DOT:
    break;
  case CLOSE_PAREN:
    break;
  case EMPTY_PAIR:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"toString unknown token kind");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() {
    std::string s;
    switch (kind) {
      case TokenKind::WHITESPACE:
        s.push_back(' ');
        break;
      case TokenKind::SYMBOL:
        s.append(*str);
        break;
      case TokenKind::OPEN_PAREN:
        s.push_back('(');
        break;
      case TokenKind::DOT:
        s.push_back('.');
        break;
      case TokenKind::CLOSE_PAREN:
        s.push_back(')');
        break;
      case TokenKind::EMPTY_PAIR:
        s.append("()");
        break;
      case TokenKind::SPECIAL_SYMBOL:
        s.append(*str);
        break;
      default:
        throw std::runtime_error("toString unknown token kind");
    }
    return s;
  }